

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall
duckdb::CSVErrorHandler::FillRejectsTable
          (CSVErrorHandler *this,InternalAppender *errors_appender,idx_t file_idx,idx_t scan_idx,
          CSVFileScan *file,CSVRejectsTable *rejects,MultiFileBindData *bind_data,idx_t limit)

{
  pointer pCVar1;
  ulong __n;
  int iVar2;
  CSVErrorHandler *pCVar3;
  idx_t iVar4;
  const_reference pvVar5;
  uint *puVar6;
  CSVErrorType extraout_DL;
  CSVErrorType extraout_DL_00;
  CSVErrorType CVar7;
  pointer pcVar8;
  _Alloc_hider _Var9;
  optional_idx *this_00;
  pointer pCVar10;
  LogicalType *type;
  Value *this_01;
  string_t value;
  string_t value_00;
  string_t value_01;
  string_t value_02;
  uint local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  uint local_278;
  undefined4 local_274;
  undefined4 uStack_270;
  undefined4 local_26c;
  pthread_mutex_t *local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_260;
  uint local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  uint local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  uint local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  idx_t local_228;
  idx_t local_220;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_218;
  ulong local_210;
  string local_208;
  LogicalType local_1e8;
  LogicalType local_1d0;
  LogicalType local_1b8;
  LogicalType local_1a0;
  LogicalType local_188;
  Value local_170;
  Value local_130;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  local_228 = file_idx;
  local_220 = scan_idx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  local_218 = &file->error_handler;
  local_268 = (pthread_mutex_t *)this;
  pCVar3 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_218);
  pCVar10 = (pCVar3->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
            super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (pCVar3->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar1) {
    local_210 = limit - 1;
    local_260 = &bind_data->names;
    this_00 = &pCVar10->byte_position;
    do {
      if (((*(CSVErrorType *)(this_00 + -9) < 10) &&
          ((0x35dU >> (*(CSVErrorType *)(this_00 + -9) & 0x1f) & 1) != 0)) &&
         (rejects->count <= local_210)) {
        rejects->count = rejects->count + 1;
        pCVar3 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_218);
        iVar4 = GetLineInternal(pCVar3,(LinesPerBoundary *)(this_00 + -3));
        __n = this_00[-8].index;
        BaseAppender::BeginRow(&errors_appender->super_BaseAppender);
        BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,local_220);
        BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,local_228);
        BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar4);
        BaseAppender::Append<unsigned_long>
                  (&errors_appender->super_BaseAppender,this_00[-1].index + 1);
        if (this_00->index == 0xffffffffffffffff) {
          LogicalType::LogicalType(&local_1d0,SQLNULL);
          Value::Value(&local_70,&local_1d0);
          BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_70);
          Value::~Value(&local_70);
          LogicalType::~LogicalType(&local_1d0);
        }
        else {
          iVar4 = optional_idx::GetIndex(this_00);
          BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar4 + 1);
        }
        if (*(CSVErrorType *)(this_00 + -9) == MAXIMUM_LINE_SIZE) {
          LogicalType::LogicalType(&local_1e8,SQLNULL);
          Value::Value(&local_b0,&local_1e8);
          BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_b0);
          Value::~Value(&local_b0);
          LogicalType::~LogicalType(&local_1e8);
        }
        else {
          BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,__n + 1);
        }
        CVar7 = *(CSVErrorType *)(this_00 + -9);
        if (CVar7 == TOO_FEW_COLUMNS) {
          if ((ulong)((long)(bind_data->names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(bind_data->names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n + 1) {
            LogicalType::LogicalType(&local_1a0,SQLNULL);
            this_01 = &local_130;
            type = &local_1a0;
            Value::Value(this_01,type);
            BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
            goto LAB_00ba557d;
          }
          pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](local_260,__n + 1);
          pcVar8 = (pvVar5->_M_dataplus)._M_p;
          local_278 = (uint)pvVar5->_M_string_length;
          if (local_278 < 0xd) {
            local_26c = 0;
            local_274 = 0;
            uStack_270 = 0;
            if (local_278 == 0) {
              puVar6 = &local_278;
LAB_00ba5728:
              pcVar8 = (pointer)0x0;
              goto LAB_00ba572a;
            }
            switchD_00b03519::default(&local_274,pcVar8,(ulong)(local_278 & 0xf));
            pcVar8 = (pointer)CONCAT44(local_26c,uStack_270);
          }
          else {
            local_274 = *(undefined4 *)pcVar8;
            uStack_270 = SUB84(pcVar8,0);
            local_26c = (undefined4)((ulong)pcVar8 >> 0x20);
          }
          puVar6 = &local_278;
LAB_00ba572a:
          value.value.pointer.ptr = pcVar8;
          value.value._0_8_ = *(undefined8 *)puVar6;
          BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value);
          CVar7 = extraout_DL_00;
        }
        else {
          if ((CVar7 == MAXIMUM_LINE_SIZE) || (CVar7 == TOO_MANY_COLUMNS)) {
            LogicalType::LogicalType(&local_188,SQLNULL);
            this_01 = &local_f0;
            type = &local_188;
            Value::Value(this_01,type);
            BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
          }
          else {
            if (__n < (ulong)((long)(bind_data->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(bind_data->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[](local_260,__n);
              pcVar8 = (pvVar5->_M_dataplus)._M_p;
              local_288 = (uint)pvVar5->_M_string_length;
              if (local_288 < 0xd) {
                uStack_27c = 0;
                uStack_284 = 0;
                uStack_280 = 0;
                puVar6 = &local_288;
                if (local_288 == 0) goto LAB_00ba5728;
                switchD_00b03519::default(&uStack_284,pcVar8,(ulong)(local_288 & 0xf));
                pcVar8 = (pointer)CONCAT44(uStack_27c,uStack_280);
                puVar6 = &local_288;
              }
              else {
                uStack_284 = *(undefined4 *)pcVar8;
                uStack_280 = SUB84(pcVar8,0);
                uStack_27c = (undefined4)((ulong)pcVar8 >> 0x20);
                puVar6 = &local_288;
              }
              goto LAB_00ba572a;
            }
            LogicalType::LogicalType(&local_1b8,SQLNULL);
            this_01 = &local_170;
            type = &local_1b8;
            Value::Value(this_01,type);
            BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
          }
LAB_00ba557d:
          Value::~Value(this_01);
          LogicalType::~LogicalType(type);
          CVar7 = extraout_DL;
        }
        CSVErrorTypeToEnum_abi_cxx11_
                  (&local_208,(duckdb *)(ulong)*(CSVErrorType *)(this_00 + -9),CVar7);
        local_238 = (uint)local_208._M_string_length;
        if (local_238 < 0xd) {
          uStack_22c = 0;
          uStack_234 = 0;
          uStack_230 = 0;
          if (local_238 == 0) {
            _Var9._M_p = (pointer)0x0;
          }
          else {
            switchD_00b03519::default
                      (&uStack_234,local_208._M_dataplus._M_p,(ulong)(local_238 & 0xf));
            _Var9._M_p = (pointer)CONCAT44(uStack_22c,uStack_230);
          }
        }
        else {
          uStack_234 = *(undefined4 *)local_208._M_dataplus._M_p;
          uStack_230 = SUB84(local_208._M_dataplus._M_p,0);
          uStack_22c = (undefined4)((ulong)local_208._M_dataplus._M_p >> 0x20);
          _Var9._M_p = local_208._M_dataplus._M_p;
        }
        value_00.value._4_1_ = (undefined1)uStack_234;
        value_00.value._5_1_ = uStack_234._1_1_;
        value_00.value._6_1_ = uStack_234._2_1_;
        value_00.value._7_1_ = uStack_234._3_1_;
        value_00.value.pointer.length = local_238;
        value_00.value.pointer.ptr = _Var9._M_p;
        BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        pcVar8 = (((string *)(this_00 + -7))->_M_dataplus)._M_p;
        local_248 = (uint)this_00[-6].index;
        if (local_248 < 0xd) {
          uStack_23c = 0;
          uStack_244 = 0;
          uStack_240 = 0;
          if (local_248 == 0) {
            pcVar8 = (pointer)0x0;
          }
          else {
            switchD_00b03519::default(&uStack_244,pcVar8,(ulong)(local_248 & 0xf));
            pcVar8 = (pointer)CONCAT44(uStack_23c,uStack_240);
          }
        }
        else {
          uStack_244 = *(undefined4 *)pcVar8;
          uStack_240 = SUB84(pcVar8,0);
          uStack_23c = (undefined4)((ulong)pcVar8 >> 0x20);
        }
        value_01.value._4_1_ = (undefined1)uStack_244;
        value_01.value._5_1_ = uStack_244._1_1_;
        value_01.value._6_1_ = uStack_244._2_1_;
        value_01.value._7_1_ = uStack_244._3_1_;
        value_01.value.pointer.length = local_248;
        value_01.value.pointer.ptr = pcVar8;
        BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value_01);
        pcVar8 = (((CSVError *)(this_00 + -0x11))->error_message)._M_dataplus._M_p;
        local_258 = (uint)this_00[-0x10].index;
        if (local_258 < 0xd) {
          uStack_24c = 0;
          uStack_254 = 0;
          uStack_250 = 0;
          if (local_258 == 0) {
            pcVar8 = (pointer)0x0;
          }
          else {
            switchD_00b03519::default(&uStack_254,pcVar8,(ulong)(local_258 & 0xf));
            pcVar8 = (pointer)CONCAT44(uStack_24c,uStack_250);
          }
        }
        else {
          uStack_254 = *(undefined4 *)pcVar8;
          uStack_250 = SUB84(pcVar8,0);
          uStack_24c = (undefined4)((ulong)pcVar8 >> 0x20);
        }
        value_02.value._4_1_ = (undefined1)uStack_254;
        value_02.value._5_1_ = uStack_254._1_1_;
        value_02.value._6_1_ = uStack_254._2_1_;
        value_02.value._7_1_ = uStack_254._3_1_;
        value_02.value.pointer.length = local_258;
        value_02.value.pointer.ptr = pcVar8;
        BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value_02);
        BaseAppender::EndRow(&errors_appender->super_BaseAppender);
      }
      pCVar10 = (pointer)(this_00 + 1);
      this_00 = this_00 + 0x12;
    } while (pCVar10 != pCVar1);
  }
  pthread_mutex_unlock(local_268);
  return;
}

Assistant:

void CSVErrorHandler::FillRejectsTable(InternalAppender &errors_appender, const idx_t file_idx, const idx_t scan_idx,
                                       const CSVFileScan &file, CSVRejectsTable &rejects,
                                       const MultiFileBindData &bind_data, const idx_t limit) {
	lock_guard<mutex> parallel_lock(main_mutex);
	// We first insert the file into the file scans table
	for (auto &error : file.error_handler->errors) {
		if (!IsCSVErrorAcceptedReject(error.type)) {
			continue;
		}
		// short circuit if we already have too many rejects
		if (limit == 0 || rejects.count < limit) {
			if (limit != 0 && rejects.count >= limit) {
				break;
			}
			rejects.count++;
			const auto row_line = file.error_handler->GetLineInternal(error.error_info);
			const auto col_idx = error.column_idx;
			// Add the row to the rejects table
			errors_appender.BeginRow();
			// 1. Scan ID
			errors_appender.Append(scan_idx);
			// 2. File ID
			errors_appender.Append(file_idx);
			// 3. Row Line
			errors_appender.Append(row_line);
			// 4. Byte Position of the row error
			errors_appender.Append(error.row_byte_position + 1);
			// 5. Byte Position where error occurred
			if (!error.byte_position.IsValid()) {
				// This means this error comes from a flush, and we don't support this yet, so we give it
				// a null
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(error.byte_position.GetIndex() + 1);
			}
			// 6. Column Index
			if (error.type == CSVErrorType::MAXIMUM_LINE_SIZE) {
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(col_idx + 1);
			}
			// 7. Column Name (If Applicable)
			switch (error.type) {
			case CSVErrorType::TOO_MANY_COLUMNS:
			case CSVErrorType::MAXIMUM_LINE_SIZE:
				errors_appender.Append(Value());
				break;
			case CSVErrorType::TOO_FEW_COLUMNS:
				if (col_idx + 1 < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx + 1]));
				} else {
					errors_appender.Append(Value());
				}
				break;
			default:
				if (col_idx < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx]));
				} else {
					errors_appender.Append(Value());
				}
			}
			// 8. Error Type
			errors_appender.Append(string_t(CSVErrorTypeToEnum(error.type)));
			// 9. Original CSV Line
			errors_appender.Append(string_t(error.csv_row));
			// 10. Full Error Message
			errors_appender.Append(string_t(error.error_message));
			errors_appender.EndRow();
		}
	}
}